

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rotation.cpp
# Opt level: O3

string * __thiscall
iDynTree::Rotation::toString_abi_cxx11_(string *__return_storage_ptr__,Rotation *this)

{
  ostream *poVar1;
  stringstream ss;
  stringstream asStack_1a8 [128];
  ios_base local_128 [264];
  
  std::__cxx11::stringstream::stringstream(asStack_1a8);
  poVar1 = std::ostream::_M_insert<double>((this->super_Matrix3x3).m_data[0]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::ostream::_M_insert<double>((this->super_Matrix3x3).m_data[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::ostream::_M_insert<double>((this->super_Matrix3x3).m_data[2]);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  poVar1 = std::ostream::_M_insert<double>((this->super_Matrix3x3).m_data[3]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::ostream::_M_insert<double>((this->super_Matrix3x3).m_data[4]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::ostream::_M_insert<double>((this->super_Matrix3x3).m_data[5]);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  poVar1 = std::ostream::_M_insert<double>((this->super_Matrix3x3).m_data[6]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::ostream::_M_insert<double>((this->super_Matrix3x3).m_data[7]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::ostream::_M_insert<double>((this->super_Matrix3x3).m_data[8]);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_1a8);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string Rotation::toString() const
    {
        std::stringstream ss;

        ss << this->m_data[0]
        << " " << this->m_data[1]
        << " " << this->m_data[2] << std::endl;
        ss << this->m_data[3]
        << " " << this->m_data[4]
        << " " << this->m_data[5] << std::endl;
        ss << this->m_data[6]
        << " " << this->m_data[7]
        << " " << this->m_data[8] << std::endl;

        return ss.str();
    }